

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_is_nil(asmcode *code,compiler_options *param_2)

{
  operand local_40;
  operation local_3c [2];
  operand local_34;
  
  local_3c[0] = CMP;
  local_40 = RCX;
  local_34 = NUMBER;
  local_3c[1] = 0x1f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_3c,&local_40,&local_34,(int *)(local_3c + 1));
  local_3c[0] = SETE;
  local_40 = AL;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_3c,&local_40);
  local_3c[0] = MOVZX;
  local_40 = RAX;
  local_34 = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_3c,&local_40,&local_34);
  local_3c[0] = SHL;
  local_3c[1] = 3;
  local_40 = RAX;
  local_34 = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_3c,&local_40,&local_34,(int *)(local_3c + 1));
  local_3c[0] = OR;
  local_40 = RAX;
  local_3c[1] = 7;
  local_34 = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_3c,&local_40,&local_34,(int *)(local_3c + 1));
  local_3c[0] = JMP;
  local_40 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_3c,&local_40);
  return;
}

Assistant:

void compile_is_nil(asmcode& code, const compiler_options&)
  {
  code.add(asmcode::CMP, asmcode::RCX, asmcode::NUMBER, nil);
  code.add(asmcode::SETE, asmcode::AL);
  // movzx extends the bits in al to the full rax register
  code.add(asmcode::MOVZX, asmcode::RAX, asmcode::AL);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 3);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::JMP, CONTINUE);
  }